

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

char * FBaseCVar::ToString(UCVarValue value,ECVarType type)

{
  float fStack_18;
  ECVarType type_local;
  UCVarValue value_local;
  
  fStack_18 = value.Float;
  switch(type) {
  case CVAR_Bool:
    if (((ulong)value.String & 1) == 0) {
      return falsestr;
    }
    return truestr;
  case CVAR_Int:
    mysnprintf(cstrbuf,0x28,"%i",(ulong)value.String & 0xffffffff);
    break;
  case CVAR_Float:
    mysnprintf(cstrbuf,0x28,"%H",(double)fStack_18);
    break;
  case CVAR_String:
    return value.String;
  default:
    strcpy(cstrbuf,"<huh?>");
    break;
  case CVAR_GUID:
    FormatGUID(cstrbuf,0x28,value.pGUID);
  }
  value_local.String = cstrbuf;
  return value_local.String;
}

Assistant:

const char *FBaseCVar::ToString (UCVarValue value, ECVarType type)
{
	switch (type)
	{
	case CVAR_Bool:
		return value.Bool ? truestr : falsestr;

	case CVAR_String:
		return value.String;

	case CVAR_Int:
		mysnprintf (cstrbuf, countof(cstrbuf), "%i", value.Int);
		break;

	case CVAR_Float:
		IGNORE_FORMAT_PRE
		mysnprintf (cstrbuf, countof(cstrbuf), "%H", value.Float);
		IGNORE_FORMAT_POST
		break;

	case CVAR_GUID:
		FormatGUID (cstrbuf, countof(cstrbuf), *value.pGUID);
		break;

	default:
		strcpy (cstrbuf, "<huh?>");
		break;
	}
	return cstrbuf;
}